

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a9764::CommandLineParser::printOptionValues(CommandLineParser *this)

{
  long *plVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  size_t sVar6;
  size_t e_1;
  size_t i_1;
  size_t local_868;
  size_t e;
  size_t i;
  size_t MaxArgLen;
  SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U> Opts;
  CommandLineParser *this_local;
  
  Opts.super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>.InlineElts[0x7f].
  super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = this;
  bVar2 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)&PrintOptions.super_opt_storage<bool,_false,_false>);
  if ((bVar2) ||
     (bVar2 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage *)&PrintAllOptions.super_opt_storage<bool,_false,_false>),
     bVar2)) {
    llvm::SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>::SmallVector
              ((SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U> *)&MaxArgLen);
    sortOpts(&this->ActiveSubCommand->OptionsMap,
             (SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *)&MaxArgLen,true);
    i = 0;
    e = 0;
    local_868 = llvm::SmallVectorBase::size((SmallVectorBase *)&MaxArgLen);
    for (; sVar5 = e, e != local_868; e = e + 1) {
      sVar3 = llvm::SmallVectorBase::size((SmallVectorBase *)&MaxArgLen);
      if (sVar3 <= sVar5) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
                     );
      }
      i_1 = (**(code **)(**(long **)(MaxArgLen + sVar5 * 0x10 + 8) + 0x28))();
      puVar4 = std::max<unsigned_long>(&i,&i_1);
      i = *puVar4;
    }
    e_1 = 0;
    sVar5 = llvm::SmallVectorBase::size((SmallVectorBase *)&MaxArgLen);
    for (; e_1 != sVar5; e_1 = e_1 + 1) {
      sVar6 = llvm::SmallVectorBase::size((SmallVectorBase *)&MaxArgLen);
      sVar3 = i;
      if (sVar6 <= e_1) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
                     );
      }
      plVar1 = *(long **)(MaxArgLen + e_1 * 0x10 + 8);
      bVar2 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage *)&PrintAllOptions.super_opt_storage<bool,_false,_false>);
      (**(code **)(*plVar1 + 0x38))(plVar1,sVar3,bVar2);
    }
    llvm::SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>::~SmallVector
              ((SmallVector<std::pair<const_char_*,_llvm::cl::Option_*>,_128U> *)&MaxArgLen);
  }
  return;
}

Assistant:

void CommandLineParser::printOptionValues() {
  if (!PrintOptions && !PrintAllOptions)
    return;

  SmallVector<std::pair<const char *, Option *>, 128> Opts;
  sortOpts(ActiveSubCommand->OptionsMap, Opts, /*ShowHidden*/ true);

  // Compute the maximum argument length...
  size_t MaxArgLen = 0;
  for (size_t i = 0, e = Opts.size(); i != e; ++i)
    MaxArgLen = std::max(MaxArgLen, Opts[i].second->getOptionWidth());

  for (size_t i = 0, e = Opts.size(); i != e; ++i)
    Opts[i].second->printOptionValue(MaxArgLen, PrintAllOptions);
}